

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testInvalidPacketAreDetected(void)

{
  ostream *poVar1;
  string serialized_test;
  string serialized;
  PacketT<packet::DefaultConfig> pkt;
  string pkt_msg;
  
  std::__cxx11::string::string((string *)&pkt_msg,"this is a example of message",(allocator *)&pkt);
  serializePacketFromData<packet::PacketT<packet::DefaultConfig>>(&serialized,&pkt_msg);
  std::__cxx11::string::string((string *)&serialized_test,(string *)&serialized);
  *serialized_test._M_dataplus._M_p = '=';
  readPacket<packet::PacketT<packet::DefaultConfig>>(&pkt,&serialized_test);
  if (pkt.status_ != INVALID) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"testInvalidPacketAreDetected");
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x7e);
    std::operator<<(poVar1,"] TEST_ASSERT failed pkt.status() == packet::Status::INVALID\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x7e,"void testInvalidPacketAreDetected()");
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pkt.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&serialized_test);
  std::__cxx11::string::string((string *)&serialized_test,(string *)&serialized);
  serialized_test._M_dataplus._M_p[serialized_test._M_string_length - 1] = '?';
  readPacket<packet::PacketT<packet::DefaultConfig>>(&pkt,&serialized_test);
  if (pkt.status_ == INVALID) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pkt.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&serialized_test);
    std::__cxx11::string::~string((string *)&serialized);
    std::__cxx11::string::~string((string *)&pkt_msg);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"[");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"testInvalidPacketAreDetected");
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x86);
  std::operator<<(poVar1,"] TEST_ASSERT failed pkt.status() == packet::Status::INVALID\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                ,0x86,"void testInvalidPacketAreDetected()");
}

Assistant:

void
testInvalidPacketAreDetected()
{
    const std::string pkt_msg = "this is a example of message";
    const std::string serialized = serializePacketFromData<packet::DefaultPacket>(pkt_msg);
    {
        // invalid head
        std::string serialized_test = serialized;
        serialized_test[0] = packet::DefaultStartPattern::value[0] + 1;
        auto pkt = readPacket<packet::DefaultPacket>(serialized_test);
        TEST_ASSERT(pkt.status() == packet::Status::INVALID);
    }

    {
        // invalid tail
        std::string serialized_test = serialized;
        serialized_test[serialized_test.size() - 1] = packet::DefaultEndPattern::value[0] + 1;
        auto pkt = readPacket<packet::DefaultPacket>(serialized_test);
        TEST_ASSERT(pkt.status() == packet::Status::INVALID);
    }
}